

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceRuntimeLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface)

{
  cmMakefile *this_00;
  size_type sVar1;
  cmGeneratorTarget *t;
  bool bVar2;
  iterator iVar3;
  cmValue cVar4;
  mapped_type *pmVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
  *this_01;
  cmGeneratorTarget *pcVar6;
  pointer __lhs;
  _Alloc_hider name;
  string_view arg;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> implicitTargets;
  cmListFileBacktrace bt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  TargetOrString resolved;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_138;
  cmGeneratorTarget *local_118;
  string *local_110;
  pointer local_108;
  cmLocalGenerator *local_100;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  TargetOrString local_b8;
  string local_90;
  
  __lhs = (iface->super_cmLinkInterface).Languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (iface->super_cmLinkInterface).Languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &(iface->super_cmLinkInterface).LanguageRuntimeLibraries;
  local_118 = this;
  local_110 = config;
  do {
    if (__lhs == local_108) {
      return;
    }
    bVar2 = std::operator==(__lhs,"CUDA");
    if (bVar2) {
LAB_003e3173:
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_01->_M_h,__lhs);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_f8);
        pcVar6 = local_118;
        local_138.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_100 = local_118->LocalGenerator;
        GetRuntimeLinkLibrary(&local_90,local_118,__lhs,local_110);
        this_00 = pcVar6->Makefile;
        std::operator+(&local_e8,"CMAKE_",__lhs);
        std::operator+(&local_b8.String,&local_e8,"_RUNTIME_LIBRARIES_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff90,&local_b8.String,&local_90);
        cVar4 = cmMakefile::GetDefinition
                          (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&stack0xffffffffffffff90);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_e8);
        if (cVar4.Value != (string *)0x0) {
          arg._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
          arg._M_len = (cVar4.Value)->_M_string_length;
          cmExpandedList_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_e8,arg,false);
          pcVar6 = (cmGeneratorTarget *)
                   ((long)(local_e8._M_string_length - (long)local_e8._M_dataplus._M_p) >> 5);
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::reserve
                    (&local_138,(size_type)pcVar6);
          sVar1 = local_e8._M_string_length;
          for (name._M_p = local_e8._M_dataplus._M_p; name._M_p != (pointer)sVar1;
              name._M_p = name._M_p + 0x20) {
            ResolveTargetReference(&local_b8,pcVar6,(string *)name._M_p,local_100);
            t = local_b8.Target;
            if (local_b8.Target != (cmGeneratorTarget *)0x0) {
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_c8,&local_f8);
              cmLinkItem::cmLinkItem
                        ((cmLinkItem *)&stack0xffffffffffffff90,t,false,
                         (cmListFileBacktrace *)&local_c8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_c8._M_refcount);
              pcVar6 = (cmGeneratorTarget *)&stack0xffffffffffffff90;
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                        (&local_138,(cmLinkItem *)&stack0xffffffffffffff90);
              cmLinkItem::~cmLinkItem((cmLinkItem *)&stack0xffffffffffffff90);
            }
            std::__cxx11::string::~string((string *)&local_b8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_e8);
        }
        std::__cxx11::string::~string((string *)&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,__lhs);
        std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::_M_move_assign(pmVar5,&local_138);
        std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_138);
      }
    }
    else {
      bVar2 = std::operator==(__lhs,"HIP");
      if (bVar2) goto LAB_003e3173;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceRuntimeLibraries(
  const std::string& config, cmOptionalLinkInterface& iface) const
{
  for (std::string const& lang : iface.Languages) {
    if ((lang == "CUDA" || lang == "HIP") &&
        iface.LanguageRuntimeLibraries.find(lang) ==
          iface.LanguageRuntimeLibraries.end()) {
      auto implicitTargets =
        computeImplicitLanguageTargets<cmLinkItem>(lang, config, this);
      iface.LanguageRuntimeLibraries[lang] = std::move(implicitTargets);
    }
  }
}